

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall
tetgenmesh::orthosphere
          (tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double aheight,
          double bheight,double cheight,double dheight,double *orthocent,double *radius)

{
  double dVar1;
  bool bVar2;
  tetgenmesh *this_00;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  int indx [4];
  double D;
  double local_98;
  double local_90;
  double dStack_88;
  double local_80;
  undefined8 local_78;
  double local_70;
  double dStack_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double dStack_48;
  double local_40;
  undefined8 local_38;
  double local_30;
  double dStack_28;
  double local_20;
  
  this_00 = (tetgenmesh *)0x3ff0000000000000;
  local_98 = 1.0;
  local_90 = *pa;
  dStack_88 = pa[1];
  local_80 = pa[2];
  local_78 = 0x3ff0000000000000;
  local_70 = *pb;
  dStack_68 = pb[1];
  local_60 = pb[2];
  local_58 = 0x3ff0000000000000;
  local_50 = *pc;
  dStack_48 = pc[1];
  local_40 = pc[2];
  local_38 = 0x3ff0000000000000;
  local_30 = *pd;
  dStack_28 = pd[1];
  local_20 = pd[2];
  local_d8._8_4_ = SUB84(bheight * 0.5,0);
  local_d8._0_8_ = aheight * 0.5;
  local_d8._12_4_ = (int)((ulong)(bheight * 0.5) >> 0x20);
  local_c8 = cheight * 0.5;
  dStack_c0 = dheight * 0.5;
  bVar2 = lu_decmp((tetgenmesh *)0x3ff0000000000000,(double (*) [4])&local_98,4,indx,&D,0);
  if (bVar2) {
    lu_solve(this_00,(double (*) [4])&local_98,4,indx,(double *)local_d8,0);
    if (orthocent != (double *)0x0) {
      *orthocent = (double)local_d8._8_8_;
      orthocent[1] = local_c8;
      orthocent[2] = dStack_c0;
    }
    if (radius == (double *)0x0) {
      return bVar2;
    }
    dVar1 = (double)local_d8._0_8_ + (double)local_d8._0_8_ +
            dStack_c0 * dStack_c0 +
            (double)local_d8._8_8_ * (double)local_d8._8_8_ + local_c8 * local_c8;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
  }
  else {
    dVar1 = 0.0;
    if (radius == (double *)0x0) {
      return bVar2;
    }
  }
  *radius = dVar1;
  return bVar2;
}

Assistant:

bool tetgenmesh::orthosphere(REAL* pa, REAL* pb, REAL* pc, REAL* pd,
                             REAL  aheight, REAL bheight, REAL cheight, 
                             REAL  dheight, REAL* orthocent, REAL* radius)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];

  // Set the coefficient matrix A (4 x 4).
  A[0][0] = 1.0; A[0][1] = pa[0]; A[0][2] = pa[1]; A[0][3] = pa[2];
  A[1][0] = 1.0; A[1][1] = pb[0]; A[1][2] = pb[1]; A[1][3] = pb[2];
  A[2][0] = 1.0; A[2][1] = pc[0]; A[2][2] = pc[1]; A[2][3] = pc[2];
  A[3][0] = 1.0; A[3][1] = pd[0]; A[3][2] = pd[1]; A[3][3] = pd[2];

  // Set the right hand side vector (4 x 1).
  rhs[0] = 0.5 * aheight;
  rhs[1] = 0.5 * bheight;
  rhs[2] = 0.5 * cheight;
  rhs[3] = 0.5 * dheight;

  // Solve the 4 by 4 equations use LU decomposition with partial pivoting
  //   and backward and forward substitute..
  if (!lu_decmp(A, 4, indx, &D, 0)) {
    if (radius != (REAL *) NULL) *radius = 0.0;
    return false;
  }
  lu_solve(A, 4, indx, rhs, 0);

  if (orthocent != (REAL *) NULL) {
    orthocent[0] = rhs[1];
    orthocent[1] = rhs[2];
    orthocent[2] = rhs[3];
  }
  if (radius != (REAL *) NULL) {
    // rhs[0] = - rheight / 2;
    // rheight  = - 2 * rhs[0];
    //          =  r[0]^2 + r[1]^2 + r[2]^2 - radius^2
    // radius^2 = r[0]^2 + r[1]^2 + r[2]^2 -rheight
    //          = r[0]^2 + r[1]^2 + r[2]^2 + 2 * rhs[0]
    *radius = sqrt(rhs[1] * rhs[1] + rhs[2] * rhs[2] + rhs[3] * rhs[3]
                   + 2.0 * rhs[0]);
  }
  return true;
}